

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void scroll_callback(GLFWwindow *window,double xoffset,double yoffset)

{
  double yoffset_local;
  double xoffset_local;
  GLFWwindow *window_local;
  
  printf("scroll called [%F %F]\n",xoffset,yoffset);
  if ((1.0 <= fov) && (fov <= 45.0)) {
    fov = (float)((double)fov - yoffset);
  }
  if (fov <= 1.0) {
    fov = 1.0;
  }
  if (45.0 <= fov) {
    fov = 45.0;
  }
  return;
}

Assistant:

void scroll_callback(GLFWwindow* window, double xoffset, double yoffset)
{
    //not working on linux
  printf ("scroll called [%F %F]\n",xoffset,yoffset);
  if (fov >= 1.0f && fov <= 45.0f)
    fov -= yoffset;
  if (fov <= 1.0f)
    fov = 1.0f;
  if (fov >= 45.0f)
    fov = 45.0f;
}